

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

int __thiscall NaDynAr<NaPetriNode_*>::addl(NaDynAr<NaPetriNode_*> *this,NaPetriNode **pobj)

{
  undefined4 *puVar1;
  item *this_00;
  NaPetriNode **in_RSI;
  long in_RDI;
  item *p;
  
  if (in_RSI == (NaPetriNode **)0x0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  this_00 = (item *)operator_new(0x10);
  item::item(this_00,in_RSI);
  if (*(long *)(in_RDI + 0x10) == 0) {
    *(item **)(in_RDI + 0x18) = this_00;
    *(item **)(in_RDI + 0x10) = this_00;
  }
  else {
    this_00->pNext = *(item **)(in_RDI + 0x10);
    *(item **)(in_RDI + 0x10) = this_00;
  }
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  return 0;
}

Assistant:

virtual int	addl (type* pobj) {
    if(NULL == pobj)
      throw(na_null_pointer);

    item	*p = new item(pobj);

#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::addl(this=0x%08p), %d items, new item=0x%08p\n",
	       this, nItems, p);
#endif /* DynAr_DEBUG */

    if(NULL == pHead){
      pHead = pTail = p;
    }
    else{
      p->pNext = pHead;
      pHead = p;
    }
    ++nItems;

    return 0;
  }